

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::input_cancel(uint argc)

{
  vm_val_t *pvVar1;
  
  CVmBif::check_argc(argc,1);
  pvVar1 = sp_ + -1;
  sp_ = sp_ + -1;
  CVmConsole::read_line_cancel(&G_console_X->super_CVmConsole,(uint)(pvVar1->typ == VM_TRUE));
  return;
}

Assistant:

void CVmBifTIO::input_cancel(VMG_ uint argc)
{
    vm_val_t val;
    int reset;
    
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the 'reset' flag */
    G_stk->pop(&val);
    reset = (val.typ == VM_TRUE);

    /* cancel the line */
    G_console->read_line_cancel(vmg_ reset);
}